

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::Matcher::PushStats(Matcher *this,ContStack *contStack,Char *input)

{
  Type pRVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  
  pRVar1 = this->stats;
  if (pRVar1 != (Type)0x0) {
    pRVar1->numPushes = pRVar1->numPushes + 1;
    uVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    if (pRVar1->stackHWM < uVar2) {
      pRVar1->stackHWM = uVar2;
    }
  }
  if (this->w != (DebugWriter *)0x0) {
    DebugWriter::Print(this->w,L"PUSH ");
    pcVar3 = ContinuousPageStack<1UL>::Top
                       ((ContinuousPageStack<1UL> *)contStack,
                        (contStack->
                        super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                        topElementSize);
    pcVar4 = pcVar3 + 8;
    if (pcVar3 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    (*(code *)**(undefined8 **)pcVar4)(pcVar4,this->w,input);
    return;
  }
  return;
}

Assistant:

void Matcher::PushStats(ContStack& contStack, const Char* const input) const
    {
        if (stats != 0)
        {
            stats->numPushes++;
            if (contStack.Position() > stats->stackHWM)
                stats->stackHWM = contStack.Position();
        }
        if (w != 0)
        {
            w->Print(_u("PUSH "));
            contStack.Top()->Print(w, input);
        }
    }